

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O2

void __thiscall QtMWidgets::Slider::mousePressEvent(Slider *this,QMouseEvent *e)

{
  SliderPrivate *pSVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  QPoint QVar5;
  SliderAction SVar6;
  QPoint local_38;
  QRect hr;
  
  iVar3 = QAbstractSlider::maximum();
  iVar4 = QAbstractSlider::minimum();
  if (((iVar3 == iVar4) || (*(int *)(e + 0x44) != *(int *)(e + 0x40))) || (*(int *)(e + 0x44) != 1))
  {
    e[0xc] = (QMouseEvent)0x0;
    return;
  }
  e[0xc] = (QMouseEvent)0x1;
  hr = SliderPrivate::handleRect((this->d).d);
  local_38 = QMouseEvent::pos(e);
  cVar2 = QRect::contains((QPoint *)&hr,SUB81(&local_38,0));
  pSVar1 = (this->d).d;
  SVar6 = (SliderAction)this;
  if (cVar2 == '\0') {
    pSVar1->pressedControl = SC_ComboBoxFrame;
    local_38 = QMouseEvent::pos(e);
    iVar3 = SliderPrivate::pick(pSVar1,&local_38);
    iVar3 = SliderPrivate::pixelPosToRangeValue(pSVar1,iVar3 + ((this->d).d)->radius * -2);
    iVar4 = QAbstractSlider::value();
    if (iVar4 < iVar3) {
      iVar3 = 3;
    }
    else {
      iVar4 = QAbstractSlider::value();
      if (iVar4 <= iVar3) goto LAB_0018578a;
      iVar3 = 4;
    }
    QAbstractSlider::triggerAction(SVar6);
    QAbstractSlider::setRepeatAction(SVar6,iVar3,500);
  }
  else {
    pSVar1->pressedControl = SC_ComboBoxEditField;
    QAbstractSlider::setRepeatAction(SVar6,0,500);
    QAbstractSlider::triggerAction(SVar6);
    QWidget::update();
  }
LAB_0018578a:
  pSVar1 = (this->d).d;
  if (pSVar1->pressedControl == SC_ComboBoxEditField) {
    QVar5 = QMouseEvent::pos(e);
    local_38 = (QPoint)((ulong)(uint)(QVar5.xp - hr.x1) |
                       (long)QVar5 - (hr._0_8_ & 0xffffffff00000000) & 0xffffffff00000000);
    iVar3 = SliderPrivate::pick(pSVar1,&local_38);
    ((this->d).d)->clickOffset = iVar3;
    QAbstractSlider::setRepeatAction(SVar6,0,500);
    QAbstractSlider::setSliderDown(SUB81(this,0));
  }
  return;
}

Assistant:

void
Slider::mousePressEvent( QMouseEvent * e )
{
	if( maximum() == minimum() || ( e->buttons() ^ e->button() ) )
	{
		e->ignore();
		return;
	}

	if( e->button() == Qt::LeftButton )
	{
		e->accept();
		const QRect hr = d->handleRect();

		if( hr.contains( e->pos() ) )
		{
			d->pressedControl = QStyle::SC_SliderHandle;
			setRepeatAction( SliderNoAction );
			triggerAction( SliderMove );
			update();
		}
		else
		{
			d->pressedControl = QStyle::SC_SliderGroove;
			SliderAction action = SliderNoAction;

			const int pressValue =
				d->pixelPosToRangeValue( d->pick( e->pos() ) - 2 * d->radius );

			if( pressValue > value() )
				action = SliderPageStepAdd;
			else if( pressValue < value() )
				action = SliderPageStepSub;
			if( action )
			{
				triggerAction( action );
				setRepeatAction( action );
			}
		}

		if( d->pressedControl == QStyle::SC_SliderHandle )
		{
			d->clickOffset = d->pick( e->pos() - hr.topLeft() );
			setRepeatAction( SliderNoAction );
			setSliderDown( true );
		}
	}
	else
		e->ignore();
}